

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

bool __thiscall glslang::HlslGrammar::acceptTextureBufferType(HlslGrammar *this,TType *type)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  HlslParseContext *pHVar4;
  _func_int **pp_Var5;
  TType templateType;
  TType blockType;
  TString local_188;
  TType local_160;
  TType local_c8;
  
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokTextureBuffer);
  if (bVar1) {
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
    if (bVar1) {
      TType::TType(&local_160,EbtVoid,EvqTemporary,1,0,0,false);
      local_c8._vptr_TType = (_func_int **)0x0;
      bVar1 = acceptType(this,&local_160,(TIntermNode **)&local_c8);
      if (bVar1) {
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightAngle);
        if (bVar1) {
          local_160.qualifier._8_8_ =
               local_160.qualifier._8_8_ & 0xffff7fffffffff80 | 0x800000000006;
          iVar2 = (*local_160._vptr_TType[0x25])();
          if ((char)iVar2 == '\0') {
            __assert_fail("isStruct()",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                          ,0x9e1,"TTypeList *glslang::TType::getWritableStruct() const");
          }
          local_188._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          local_188._M_string_length = 0;
          local_188.field_2._M_local_buf[0] = '\0';
          TType::TType(&local_c8,local_160.field_13.structure,&local_188,&local_160.qualifier);
          local_c8.qualifier._8_8_ = local_c8.qualifier._8_8_ & 0xffff7fffffffff80 | 0x800000000006;
          TType::shallowCopy(type,&local_c8);
          return true;
        }
        pHVar4 = this->parseContext;
        pp_Var5 = (pHVar4->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar3 = "right angle bracket";
      }
      else {
        pHVar4 = this->parseContext;
        pp_Var5 = (pHVar4->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar3 = "type";
      }
    }
    else {
      pHVar4 = this->parseContext;
      pp_Var5 = (pHVar4->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar3 = "left angle bracket";
    }
    (*pp_Var5[0x2d])(pHVar4,&(this->super_HlslTokenStream).token,"Expected",pcVar3,"");
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptTextureBufferType(TType& type)
{
    if (! acceptTokenClass(EHTokTextureBuffer))
        return false;

    if (! acceptTokenClass(EHTokLeftAngle)) {
        expected("left angle bracket");
        return false;
    }
    
    TType templateType;
    if (! acceptType(templateType)) {
        expected("type");
        return false;
    }

    if (! acceptTokenClass(EHTokRightAngle)) {
        expected("right angle bracket");
        return false;
    }

    templateType.getQualifier().storage = EvqBuffer;
    templateType.getQualifier().readonly = true;

    TType blockType(templateType.getWritableStruct(), "", templateType.getQualifier());

    blockType.getQualifier().storage = EvqBuffer;
    blockType.getQualifier().readonly = true;

    type.shallowCopy(blockType);

    return true;
}